

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O3

int rd_conv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_named_traits *pmVar1;
  mpt_type_t mVar2;
  bool bVar3;
  
  pmVar1 = mpt_rawdata_type_traits();
  if (pmVar1 == (mpt_named_traits *)0x0) {
    mVar2 = 0x100;
  }
  else {
    mVar2 = pmVar1->type;
    if (mVar2 == type) {
      if (ptr != (void *)0x0) {
        *(mpt_convertable **)ptr = val + 1;
      }
      goto LAB_00104a0a;
    }
  }
  if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
  }
  else {
    bVar3 = type != 0;
    type = 0xfffffffd;
    if (bVar3) goto LAB_00104a0a;
    if (ptr != (void *)0x0) {
      *(char **)ptr = "\v";
    }
  }
  type = mVar2 & 0xffffffff;
LAB_00104a0a:
  return (int)type;
}

Assistant:

static int rd_conv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, val, _mt);
	const MPT_STRUCT(named_traits) *traits = mpt_rawdata_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((const void **) ptr) = &rd->_rd;
		return me;
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeBufferPtr), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &rd->_mt;
		return me;
	}
	/* TODO: type info for stage data array
	if (type == MPT_ENUM(TypeArray)) {
		if (ptr) *((const void **) ptr) = &rd->st;
		return me;
	}*/
	return MPT_ERROR(BadType);
}